

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type sVar1;
  int iVar2;
  ulong uVar3;
  allocator_type *paVar4;
  allocator_type *paVar5;
  int *piVar6;
  ostream *poVar7;
  anon_class_16_2_be660dc5_for__M_head_impl *extraout_RDX;
  anon_class_16_2_be660dc5_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_be660dc5_for__M_head_impl *__args;
  anon_class_16_2_be660dc5_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_be660dc5_for__M_head_impl *extraout_RDX_02;
  int iVar8;
  thread *t;
  long lVar9;
  _Alloc_hider _Var10;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  allocator_type *paVar13;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  vector<std::thread,_std::allocator<std::thread>_> th;
  shared_ptr<m2d::savanna::ssl_reuse::reuse_async_url_session> async_session;
  shared_ptr<get_yahoo_endpoint> endpoint;
  request request;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator_type *local_210;
  reuse_async_url_session *local_208;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_200;
  get_yahoo_endpoint *local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  size_type local_1e8;
  undefined1 local_1e0 [80];
  _Rb_tree_node_base local_190;
  size_t local_170;
  nanoseconds local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[5],_true>
            (&local_160,(char (*) [5])"John",(char (*) [5])"1000");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
            (&local_120,(char (*) [4])"Tom",(char (*) [5])"1400");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[4],_true>
            (&local_e0,(char (*) [6])"Harry",(char (*) [4])"800");
  __l._M_len = 3;
  __l._M_array = &local_160;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_1e0,(allocator_type *)&local_238);
  lVar9 = -0xc0;
  paVar11 = &local_e0.second.field_2;
  do {
    if (paVar11 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar11->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar11->_M_local_buf + -0x10));
    }
    if (paVar11->_M_local_buf + -0x20 != *(char **)(paVar11->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar11->_M_local_buf + -0x30));
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar11->_M_local_buf + -0x40);
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0);
  local_1f8 = (get_yahoo_endpoint *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<get_yahoo_endpoint,std::allocator<get_yahoo_endpoint>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
            (&local_1f0,&local_1f8,(allocator<get_yahoo_endpoint> *)&local_160,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_60);
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f0._M_pi)->_M_use_count = (local_1f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f0._M_pi)->_M_use_count = (local_1f0._M_pi)->_M_use_count + 1;
    }
  }
  local_1e0._0_8_ = &PTR__request_0026dfb8;
  local_1e0[8] = false;
  local_1e0._16_8_ = local_1f8;
  local_1e0._24_8_ = local_1f0._M_pi;
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1f0._M_pi)->_M_use_count = (local_1f0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1f0._M_pi)->_M_use_count = (local_1f0._M_pi)->_M_use_count + 1;
    }
  }
  local_1e0._32_4_ = 0xb;
  local_1e0._40_8_ = local_1e0 + 0x38;
  local_1e0._48_8_ = (char *)0x0;
  local_1e0[0x38] = '\0';
  local_190._M_left = &local_190;
  local_190._M_color = _S_red;
  local_190._M_parent = (_Base_ptr)0x0;
  local_170 = 0;
  local_168.__r = 30000000000;
  local_190._M_right = local_190._M_left;
  if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
  }
  std::__cxx11::string::_M_replace((ulong)(local_1e0 + 0x28),0,(char *)local_1e0._48_8_,0x1c6444);
  local_1e0[8] = true;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_160,(char (*) [2])"A",(char (*) [2])0x1c8531);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_120,(char (*) [2])0x1c86d7,(char (*) [2])0x1c8697);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_e0,(char (*) [2])0x1c71a3,(char (*) [2])0x1c6c61);
  if ((boost::beast::http::detail::get_field_table()::tab == '\0') &&
     (iVar8 = __cxa_guard_acquire(&boost::beast::http::detail::get_field_table()::tab), iVar8 != 0))
  {
    boost::beast::http::detail::field_table::field_table
              ((field_table *)boost::beast::http::detail::get_field_table()::tab);
    __cxa_guard_release(&boost::beast::http::detail::get_field_table()::tab);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,boost::beast::http::detail::get_field_table()::tab._1248_8_,
             boost::beast::http::detail::get_field_table()::tab._1256_8_ +
             boost::beast::http::detail::get_field_table()::tab._1248_8_);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[11],_true>
            (&local_a0,&local_238,(char (*) [11])"text/plain");
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_assign_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)(local_1e0 + 0x48),&local_160,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_60);
  lVar9 = -0x100;
  paVar11 = &local_a0.second.field_2;
  do {
    if (paVar11 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar11->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar11->_M_local_buf + -0x10));
    }
    if (paVar11->_M_local_buf + -0x20 != *(char **)(paVar11->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar11->_M_local_buf + -0x30));
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar11->_M_local_buf + -0x40);
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  local_208 = (reuse_async_url_session *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<m2d::savanna::ssl_reuse::reuse_async_url_session,std::allocator<m2d::savanna::ssl_reuse::reuse_async_url_session>>
            (&local_200,&local_208,
             (allocator<m2d::savanna::ssl_reuse::reuse_async_url_session> *)&local_160);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Wait...",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  local_238._M_dataplus._M_p = (pointer)0x0;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity = 0;
  iVar8 = 0;
  __args = extraout_RDX;
  do {
    sVar1 = local_238._M_string_length;
    local_160.first._M_dataplus._M_p = (pointer)&local_208;
    local_160.first._M_string_length = (size_type)local_1e0;
    if (local_238._M_string_length == local_238.field_2._M_allocated_capacity) {
      local_210 = (allocator_type *)local_238._M_dataplus._M_p;
      if (local_238._M_string_length - (long)local_238._M_dataplus._M_p == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar12 = (long)(local_238._M_string_length - (long)local_238._M_dataplus._M_p) >> 3;
      uVar3 = uVar12 + (uVar12 == 0);
      local_1e8 = uVar3 + uVar12;
      if (0xffffffffffffffe < local_1e8) {
        local_1e8 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar3,uVar12)) {
        local_1e8 = 0xfffffffffffffff;
      }
      if (local_1e8 == 0) {
        paVar4 = (allocator_type *)0x0;
      }
      else {
        paVar4 = (allocator_type *)
                 __gnu_cxx::new_allocator<std::thread>::allocate
                           ((new_allocator<std::thread> *)&local_238,local_1e8,(void *)0x0);
        __args = extraout_RDX_00;
      }
      std::allocator_traits<std::allocator<std::thread>>::construct<std::thread,main::__0>
                (paVar4 + uVar12 * 8,(thread *)&local_160,__args);
      paVar13 = paVar4;
      for (paVar5 = local_210; paVar5 != (allocator_type *)sVar1; paVar5 = paVar5 + 8) {
        *(id *)paVar13 = (id)0x0;
        *(native_handle_type *)paVar13 = (native_handle_type)*(id *)paVar5;
        *(id *)paVar5 = (id)0x0;
        paVar13 = paVar13 + 8;
      }
      if (local_210 != (allocator_type *)0x0) {
        operator_delete(local_210);
      }
      local_238.field_2._M_allocated_capacity = (size_type)(paVar4 + local_1e8 * 8);
      local_238._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      std::allocator_traits<std::allocator<std::thread>>::construct<std::thread,main::__0>
                ((allocator_type *)local_238._M_string_length,(thread *)&local_160,__args);
      paVar13 = (allocator_type *)local_238._M_string_length;
    }
    local_238._M_string_length = (size_type)(paVar13 + 8);
    local_160.first._M_dataplus._M_p = (pointer)0x0;
    local_160.first._M_string_length = 200000000;
    do {
      iVar2 = nanosleep((timespec *)&local_160,(timespec *)&local_160);
      __args = extraout_RDX_01;
      if (iVar2 != -1) break;
      piVar6 = __errno_location();
      __args = extraout_RDX_02;
    } while (*piVar6 == 4);
    sVar1 = local_238._M_string_length;
    iVar8 = iVar8 + 1;
    _Var10._M_p = local_238._M_dataplus._M_p;
    if (iVar8 == 3) {
      for (; _Var10._M_p != (pointer)sVar1;
          _Var10._M_p = (pointer)((allocator_type *)_Var10._M_p + 8)) {
        std::thread::join();
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Finish",6);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
      std::ostream::put(-0x78);
      std::ostream::flush();
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
                  *)&local_160,&(local_208->ssl_cache_)._M_t);
      for (; (size_type *)local_160.first.field_2._8_8_ != &local_160.first._M_string_length;
          local_160.first.field_2._8_8_ = std::_Rb_tree_increment(local_160.first.field_2._8_8_)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"host: ",6);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(local_160.first.field_2._8_8_ + 0x20),
                            (long)((_Rb_tree_node_base *)(local_160.first.field_2._8_8_ + 0x20))->
                                  _M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", session_ptr: ",0xf);
        std::ostream::_M_insert<void_const*>(poVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ssl_session_st>_>_>_>
                   *)&local_160);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&local_238);
      if (local_200._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200._M_pi);
      }
      m2d::savanna::ssl_reuse::request::~request((request *)local_1e0);
      if (local_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1f0._M_pi);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
	std::map<std::string, std::string> params {
		{ "John", "1000" },
		{ "Tom", "1400" },
		{ "Harry", "800" }
	};
	auto endpoint = std::make_shared<get_yahoo_endpoint>(params);
	savanna::ssl_reuse::request request(endpoint);
	//    auto endpoint = post_localhost_endpoint(params);
	//    savanna::request<post_localhost_endpoint> request(std::move(endpoint));
	request.body = "BODY";
	request.follow_location = true;

	// see also
	// https://www.boost.org/doc/libs/1_72_0/boost/beast/http/field.hpp
	request.header_fields = {
		{ "A", "a" },
		{ "B", "b" },
		{ "C", "c" },
		{ savanna::to_string(http::field::content_type), "text/plain" }
	};

	auto async_session = std::make_shared<savanna::ssl_reuse::reuse_async_url_session>();
	std::cout << "Wait..." << std::endl;

	std::vector<std::thread> th;
	for(int i=0; i<3; i++){
		th.emplace_back([&] {
			ssl::context ssl_ctx(ssl::context::tlsv12_client);
			std::once_flag once;
			std::call_once(once, savanna::load_root_cert, m2d::root_cert(), ssl_ctx);
			auto executor = async_session->prepare<http::dynamic_body>(std::move(ssl_ctx));
			executor->send(request, [&](savanna::result<http::response<http::dynamic_body>> result) {
				if (result.error) {
					auto e = *(result.error);
					std::cout << "Error: " << e.what() << ", code: " << e.code() << std::endl;
					return;
				}

				auto response = *(result.response);
				//		std::cout << "Got response: " << response << std::endl;
				std::cout << "Got response" << std::endl;
			});
			std::cout << "Done" << std::endl << std::endl;
		});
		std::this_thread::sleep_for(std::chrono::milliseconds(200));
	}
	for(auto &t : th){
		t.join();
	}
	std::cout << "Finish" << std::endl;
	for(const auto &item : async_session->ssl_cache()){
		std::cout << "host: " << item.first << ", session_ptr: " << item.second << std::endl;
	}
	return 0;
}